

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void P_ProcessSideTextures
               (bool checktranmap,side_t *sd,sector_t *sec,intmapsidedef_t *msd,int special,int tag,
               short *alpha,FMissingTextureTracker *missingtex)

{
  sector_t *psVar1;
  bool bVar2;
  uint32 uVar3;
  int iVar4;
  char *pcVar5;
  intmapsidedef_t *piVar6;
  long lVar7;
  FNullTextureID local_6c;
  FTextureID local_68;
  FNullTextureID local_64;
  FTextureID local_60;
  int local_5c;
  FNullTextureID local_58;
  int lumpnum;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_50;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_4c;
  FDynamicColormap *local_48;
  FDynamicColormap *colormap;
  int s;
  bool foggood;
  uint32 uStack_34;
  bool colorgood;
  DWORD fog;
  DWORD color;
  int tag_local;
  int special_local;
  intmapsidedef_t *msd_local;
  sector_t *sec_local;
  side_t *sd_local;
  bool checktranmap_local;
  
  fog = tag;
  color = special;
  _tag_local = msd;
  msd_local = (intmapsidedef_t *)sec;
  sec_local = (sector_t *)sd;
  sd_local._7_1_ = checktranmap;
  if (special == 0xa0) {
    pcVar5 = FString::operator[](&msd->toptexture,0);
    psVar1 = sec_local;
    if (*pcVar5 == '#') {
      FNullTextureID::FNullTextureID(&local_58);
      pcVar5 = FString::operator[](&_tag_local->toptexture,1);
      lVar7 = strtol(pcVar5,(char **)0x0,10);
      lumpnum = (int)FTextureID::operator+(&local_58.super_FTextureID,-(int)lVar7);
      side_t::SetTexture((side_t *)psVar1,0,(FTextureID)lumpnum);
    }
    else {
      pcVar5 = FString::operator_cast_to_char_(&_tag_local->toptexture);
      SetTexture((side_t *)psVar1,0,pcVar5,missingtex);
    }
    psVar1 = sec_local;
    pcVar5 = FString::operator_cast_to_char_(&_tag_local->midtexture);
    SetTexture((side_t *)psVar1,1,pcVar5,missingtex);
    psVar1 = sec_local;
    pcVar5 = FString::operator_cast_to_char_(&_tag_local->bottomtexture);
    SetTexture((side_t *)psVar1,2,pcVar5,missingtex);
  }
  else if (special == 0xbe) {
    uStack_34 = 0xffffff;
    s = 0;
    pcVar5 = FString::operator_cast_to_char_(&msd->bottomtexture);
    SetTextureNoErr(sd,2,(DWORD *)&s,pcVar5,(bool *)((long)&colormap + 6),true);
    psVar1 = sec_local;
    pcVar5 = FString::operator_cast_to_char_(&_tag_local->toptexture);
    SetTextureNoErr((side_t *)psVar1,0,&stack0xffffffffffffffcc,pcVar5,(bool *)((long)&colormap + 7)
                    ,false);
    psVar1 = sec_local;
    pcVar5 = FString::operator_cast_to_char_(&_tag_local->midtexture);
    SetTexture((side_t *)psVar1,1,pcVar5,missingtex);
    if ((colormap._7_1_ & 1) != 0 || (colormap._6_1_ & 1) != 0) {
      local_48 = (FDynamicColormap *)0x0;
      for (colormap._0_4_ = 0; (int)colormap < numsectors; colormap._0_4_ = (int)colormap + 1) {
        bVar2 = FTagManager::SectorHasTag(&tagManager,(int)colormap,fog);
        if (bVar2) {
          if ((colormap._7_1_ & 1) == 0) {
            uStack_34 = PalEntry::operator_cast_to_unsigned_int
                                  (&(sectors[(int)colormap].ColorMap)->Color);
          }
          if ((colormap._6_1_ & 1) == 0) {
            s = PalEntry::operator_cast_to_unsigned_int(&(sectors[(int)colormap].ColorMap)->Fade);
          }
          if (((local_48 == (FDynamicColormap *)0x0) ||
              (uVar3 = PalEntry::operator_cast_to_unsigned_int(&local_48->Color), uVar3 != uStack_34
              )) || (uVar3 = PalEntry::operator_cast_to_unsigned_int(&local_48->Fade), uVar3 != s))
          {
            PalEntry::PalEntry((PalEntry *)&local_4c.field_0,uStack_34);
            PalEntry::PalEntry((PalEntry *)&local_50.field_0,s);
            local_48 = GetSpecialLights((PalEntry)local_4c.field_0,(PalEntry)local_50.field_0,0);
          }
          sectors[(int)colormap].ColorMap = local_48;
        }
      }
    }
  }
  else {
    if (special == 0xd0) {
      if (checktranmap) {
        pcVar5 = FString::operator_cast_to_char_(&msd->midtexture);
        iVar4 = strncasecmp("TRANMAP",pcVar5,8);
        psVar1 = sec_local;
        if (iVar4 == 0) {
          FNullTextureID::FNullTextureID(&local_64);
          local_60 = local_64.super_FTextureID.texnum;
          side_t::SetTexture((side_t *)psVar1,1,local_64.super_FTextureID);
        }
        else {
          local_5c = FWadCollection::CheckNumForName(&Wads,&_tag_local->midtexture);
          if ((local_5c < 1) ||
             (iVar4 = FWadCollection::LumpLength(&Wads,local_5c), iVar4 != 0x10000)) {
            psVar1 = sec_local;
            pcVar5 = FString::operator_cast_to_char_(&_tag_local->midtexture);
            SetTexture((side_t *)psVar1,1,pcVar5,missingtex);
          }
          else {
            iVar4 = P_DetermineTranslucency(local_5c);
            psVar1 = sec_local;
            *alpha = (short)iVar4;
            FNullTextureID::FNullTextureID(&local_6c);
            local_68 = local_6c.super_FTextureID.texnum;
            side_t::SetTexture((side_t *)psVar1,1,local_6c.super_FTextureID);
          }
        }
        psVar1 = sec_local;
        pcVar5 = FString::operator_cast_to_char_(&_tag_local->toptexture);
        SetTexture((side_t *)psVar1,0,pcVar5,missingtex);
        psVar1 = sec_local;
        pcVar5 = FString::operator_cast_to_char_(&_tag_local->bottomtexture);
        SetTexture((side_t *)psVar1,2,pcVar5,missingtex);
        return;
      }
    }
    else if (special == 0xd1) {
      if (sec == (sector_t *)0x0) {
        return;
      }
      pcVar5 = FString::operator_cast_to_char_(&msd->bottomtexture);
      SetTexture(sd,2,&sec->bottommap,pcVar5);
      psVar1 = sec_local;
      piVar6 = msd_local + 0x11;
      pcVar5 = FString::operator_cast_to_char_(&_tag_local->midtexture);
      SetTexture((side_t *)psVar1,1,(DWORD *)((long)&(piVar6->midtexture).Chars + 4),pcVar5);
      psVar1 = sec_local;
      piVar6 = msd_local + 0x12;
      pcVar5 = FString::operator_cast_to_char_(&_tag_local->toptexture);
      SetTexture((side_t *)psVar1,0,(DWORD *)piVar6,pcVar5);
      return;
    }
    pcVar5 = FString::operator_cast_to_char_(&msd->midtexture);
    SetTexture(sd,1,pcVar5,missingtex);
    psVar1 = sec_local;
    pcVar5 = FString::operator_cast_to_char_(&_tag_local->toptexture);
    SetTexture((side_t *)psVar1,0,pcVar5,missingtex);
    psVar1 = sec_local;
    pcVar5 = FString::operator_cast_to_char_(&_tag_local->bottomtexture);
    SetTexture((side_t *)psVar1,2,pcVar5,missingtex);
  }
  return;
}

Assistant:

void P_ProcessSideTextures(bool checktranmap, side_t *sd, sector_t *sec, intmapsidedef_t *msd, int special, int tag, short *alpha, FMissingTextureTracker &missingtex)
{
	switch (special)
	{
	case Transfer_Heights:	// variable colormap via 242 linedef
		  // [RH] The colormap num we get here isn't really a colormap,
		  //	  but a packed ARGB word for blending, so we also allow
		  //	  the blend to be specified directly by the texture names
		  //	  instead of figuring something out from the colormap.
		if (sec != NULL)
		{
			SetTexture (sd, side_t::bottom, &sec->bottommap, msd->bottomtexture);
			SetTexture (sd, side_t::mid, &sec->midmap, msd->midtexture);
			SetTexture (sd, side_t::top, &sec->topmap, msd->toptexture);
		}
		break;

	case Static_Init:
		// [RH] Set sector color and fog
		// upper "texture" is light color
		// lower "texture" is fog color
		{
			DWORD color = MAKERGB(255,255,255), fog = 0;
			bool colorgood, foggood;

			SetTextureNoErr (sd, side_t::bottom, &fog, msd->bottomtexture, &foggood, true);
			SetTextureNoErr (sd, side_t::top, &color, msd->toptexture, &colorgood, false);
			SetTexture(sd, side_t::mid, msd->midtexture, missingtex);

			if (colorgood | foggood)
			{
				int s;
				FDynamicColormap *colormap = NULL;

				for (s = 0; s < numsectors; s++)
				{
					if (tagManager.SectorHasTag(s, tag))
					{
						if (!colorgood) color = sectors[s].ColorMap->Color;
						if (!foggood) fog = sectors[s].ColorMap->Fade;
						if (colormap == NULL ||
							colormap->Color != color ||
							colormap->Fade != fog)
						{
							colormap = GetSpecialLights (color, fog, 0);
						}
						sectors[s].ColorMap = colormap;
					}
				}
			}
		}
		break;

	case Sector_Set3DFloor:
		if (msd->toptexture[0]=='#')
		{
			sd->SetTexture(side_t::top, FNullTextureID() +(-strtol(&msd->toptexture[1], NULL, 10)));	// store the alpha as a negative texture index
														// This will be sorted out by the 3D-floor code later.
		}
		else
		{
			SetTexture(sd, side_t::top, msd->toptexture, missingtex);
		}

		SetTexture(sd, side_t::mid, msd->midtexture, missingtex);
		SetTexture(sd, side_t::bottom, msd->bottomtexture, missingtex);
		break;

	case TranslucentLine:	// killough 4/11/98: apply translucency to 2s normal texture
		if (checktranmap)
		{
			int lumpnum;

			if (strnicmp ("TRANMAP", msd->midtexture, 8) == 0)
			{
				// The translator set the alpha argument already; no reason to do it again.
				sd->SetTexture(side_t::mid, FNullTextureID());
			}
			else if ((lumpnum = Wads.CheckNumForName (msd->midtexture)) > 0 &&
				Wads.LumpLength (lumpnum) == 65536)
			{
				*alpha = (short)P_DetermineTranslucency (lumpnum);
				sd->SetTexture(side_t::mid, FNullTextureID());
			}
			else
			{
				SetTexture(sd, side_t::mid, msd->midtexture, missingtex);
			}

			SetTexture(sd, side_t::top, msd->toptexture, missingtex);
			SetTexture(sd, side_t::bottom, msd->bottomtexture, missingtex);
			break;
		}
		// Fallthrough for Hexen maps is intentional

	default:			// normal cases

		SetTexture(sd, side_t::mid, msd->midtexture, missingtex);
		SetTexture(sd, side_t::top, msd->toptexture, missingtex);
		SetTexture(sd, side_t::bottom, msd->bottomtexture, missingtex);
		break;
	}
}